

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

int cfg_db_remove_namedsection(cfg_db *db,char *section_type,char *section_name)

{
  cfg_named_section *named_00;
  cfg_named_section *named;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  named_00 = cfg_db_find_namedsection(db,section_type,section_name);
  if (named_00 == (cfg_named_section *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    _free_namedsection(named_00);
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_db_remove_namedsection(struct cfg_db *db, const char *section_type, const char *section_name) {
  struct cfg_named_section *named;

  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named == NULL) {
    return -1;
  }

  /* only free named section */
  _free_namedsection(named);
  return 0;
}